

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::VertexData::VertexData(VertexData *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IVertexData).count = 0;
  (this->super_IVertexData).boneAssignments.
  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IVertexData).boneAssignments.
  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IVertexData).boneAssignments.
  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header;
  (this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_IVertexData).vertexIndexMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header;
  (this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  p_Var1 = &(this->vertexBindings)._M_t._M_impl.super__Rb_tree_header;
  (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vertexElements).
  super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertexElements).
  super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertexElements).
  super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

VertexData::VertexData()
{
}